

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void absl::lts_20250127::base_internal::LLA_SkiplistDelete
               (AllocList *head,AllocList *e,AllocList **prev)

{
  AllocList *pAVar1;
  bool bVar2;
  int local_34;
  int i;
  char *absl_raw_log_internal_basename;
  AllocList *found;
  AllocList **prev_local;
  AllocList *e_local;
  AllocList *head_local;
  
  pAVar1 = LLA_SkiplistSearch(head,e,prev);
  if (e != pAVar1) {
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0xbc,"Check %s failed: %s","e == found",
               "element not in freelist");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                  ,0xbc,
                  "void absl::base_internal::LLA_SkiplistDelete(AllocList *, AllocList *, AllocList **)"
                 );
  }
  local_34 = 0;
  while( true ) {
    bVar2 = false;
    if (local_34 != e->levels) {
      bVar2 = prev[local_34]->next[local_34] == e;
    }
    if (!bVar2) break;
    prev[local_34]->next[local_34] = e->next[local_34];
    local_34 = local_34 + 1;
  }
  while( true ) {
    bVar2 = false;
    if (0 < head->levels) {
      bVar2 = head->next[head->levels + -1] == (AllocList *)0x0;
    }
    if (!bVar2) break;
    head->levels = head->levels + -1;
  }
  return;
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  ABSL_RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == nullptr) {
    head->levels--;  // reduce head->levels if level unused
  }
}